

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  uint uVar2;
  OfType OVar3;
  IConfig *pIVar4;
  long in_RSI;
  AssertionStats *in_RDI;
  AssertionPrinter printer;
  bool printInfoMessages;
  AssertionResult *result;
  AssertionPrinter *in_stack_00000290;
  ostream *in_stack_ffffffffffffff88;
  AssertionPrinter *in_stack_ffffffffffffff90;
  undefined1 local_68 [71];
  undefined1 local_21;
  AssertionResult *local_20;
  byte local_1;
  
  local_20 = (AssertionResult *)(in_RSI + 8);
  local_21 = 1;
  pIVar4 = Ptr<const_Catch::IConfig>::operator->
                     ((Ptr<const_Catch::IConfig> *)&(in_RDI->assertionResult).m_info.field_0x8);
  uVar2 = (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[7])();
  if (((uVar2 & 1) == 0) && (bVar1 = AssertionResult::isOk((AssertionResult *)in_RDI), bVar1)) {
    OVar3 = AssertionResult::getResultType(local_20);
    if (OVar3 != Warning) {
      local_1 = 0;
      goto LAB_00198db6;
    }
    local_21 = 0;
  }
  AssertionPrinter::AssertionPrinter
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RDI,
             SUB81((ulong)local_68 >> 0x38,0));
  AssertionPrinter::print(in_stack_00000290);
  std::ostream::operator<<
            (*(void **)&(in_RDI->assertionResult).m_info.field_0x10,
             std::endl<char,std::char_traits<char>>);
  local_1 = 1;
  AssertionPrinter::~AssertionPrinter((AssertionPrinter *)0x198d9a);
LAB_00198db6:
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }